

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall
xLearn::MODEL_TEST_BestModel_Test::MODEL_TEST_BestModel_Test(MODEL_TEST_BestModel_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__MODEL_TEST_BestModel_Test_0019a0b8;
  return;
}

Assistant:

TEST(MODEL_TEST, BestModel) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 2);
  real_t* w = model_ffm.GetParameter_w();
  real_t* v = model_ffm.GetParameter_v();
  real_t* b = model_ffm.GetParameter_b();
  // Set best model
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 1;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 2;
  }
  b[0] = 3;
  b[1] = 3;
  model_ffm.SetBestModel();
  // Shrink bacj
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 0;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 0;
  }
  b[0] = 0;
  b[1] = 0;
  model_ffm.Shrink();
  // Test
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    EXPECT_FLOAT_EQ(w[i], 1);
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    EXPECT_FLOAT_EQ(v[i], 2);
  }
  EXPECT_FLOAT_EQ(b[0], 3);
  EXPECT_FLOAT_EQ(b[1], 3);
}